

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_287390::CAPIExternalCommand::provideValueExternalCommand
          (CAPIExternalCommand *this,BuildSystem *system,TaskInterface ti,uintptr_t inputID,
          BuildValue *value)

{
  BuildValue *this_00;
  BuildValue local_a0;
  
  this_00 = (BuildValue *)operator_new(0x70);
  llbuild::buildsystem::BuildValue::BuildValue(&local_a0,value);
  llbuild::buildsystem::BuildValue::BuildValue(this_00,&local_a0);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_a0);
  (*(this->cAPIDelegate).provide_value)
            ((this->cAPIDelegate).context,(llb_buildsystem_command_t *)this,
             (llb_buildsystem_interface_t *)system,(llb_task_interface_t)ti,
             (llb_build_value *)this_00,inputID);
  return;
}

Assistant:

void provideValueExternalCommand(BuildSystem& system,
                                   core::TaskInterface ti,
                                   uintptr_t inputID,
                                   const BuildValue& value) override {
    auto value_p = (llb_build_value *)new CAPIBuildValue(BuildValue(value));
    cAPIDelegate.provide_value(cAPIDelegate.context,
                               (llb_buildsystem_command_t*)this,
                               (llb_buildsystem_interface_t*)&system,
                               *reinterpret_cast<llb_task_interface_t*>(&ti),
                               value_p,
                               inputID);
  }